

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O3

void __thiscall LogFile::~LogFile(LogFile *this)

{
  pthread_mutex_t *__mutex;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::~unique_ptr(&this->file_);
  __mutex = (pthread_mutex_t *)
            (this->mutex_)._M_t.super___uniq_ptr_impl<MutexLock,_std::default_delete<MutexLock>_>.
            _M_t.super__Tuple_impl<0UL,_MutexLock_*,_std::default_delete<MutexLock>_>.
            super__Head_base<0UL,_MutexLock_*,_false>._M_head_impl;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
    pthread_mutex_destroy(__mutex);
    operator_delete(__mutex,0x28);
  }
  (this->mutex_)._M_t.super___uniq_ptr_impl<MutexLock,_std::default_delete<MutexLock>_>._M_t.
  super__Tuple_impl<0UL,_MutexLock_*,_std::default_delete<MutexLock>_>.
  super__Head_base<0UL,_MutexLock_*,_false>._M_head_impl = (MutexLock *)0x0;
  pcVar1 = (this->basename_)._M_dataplus._M_p;
  paVar2 = &(this->basename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

LogFile::~LogFile() { }